

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int LoadEXRFromMemory(float **out_rgba,int *width,int *height,uchar *memory,size_t size,char **err)

{
  char cVar1;
  uchar **ppuVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  char *pcVar6;
  ostream *poVar7;
  float *pfVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  float fVar24;
  EXRImage exr_image;
  EXRVersion exr_version;
  EXRHeader exr_header;
  stringstream ss;
  EXRImage local_3c8;
  long local_390;
  int *local_388;
  int *local_380;
  EXRVersion local_374;
  char *local_360;
  char local_350 [16];
  int *local_340 [2];
  int local_330 [10];
  int local_308;
  int local_304;
  int local_300;
  EXRChannelInfo *local_2d8;
  int *local_2d0;
  uint local_2c8;
  int *local_2c0;
  ostream *local_1b8 [2];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if (out_rgba == (float **)0x0 || memory == (uchar *)0x0) {
    piVar3 = (int *)((long)&((EXRHeader *)local_340)->data_window + 8);
    local_340[0] = piVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_340,"Invalid argument for LoadEXRFromMemory","");
    piVar4 = local_340[0];
    if (err != (char **)0x0) {
      pcVar6 = strdup((char *)local_340[0]);
      *err = pcVar6;
    }
    if (piVar4 != piVar3) {
      operator_delete(piVar4);
    }
    return -3;
  }
  local_388 = width;
  local_380 = height;
  memset((EXRHeader *)local_340,0,0x188);
  iVar5 = ParseEXRVersionFromMemory(&local_374,memory,size);
  if (iVar5 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Failed to parse EXR version. code(",0x22);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
    std::__cxx11::stringbuf::str();
    if (err != (char **)0x0) {
      pcVar6 = strdup(local_360);
      *err = pcVar6;
    }
    if (local_360 != local_350) {
      operator_delete(local_360);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    return iVar5;
  }
  iVar5 = ParseEXRHeaderFromMemory((EXRHeader *)local_340,&local_374,memory,size,err);
  if (iVar5 != 0) {
    return iVar5;
  }
  if (0 < (int)local_2c8) {
    lVar9 = 0;
    do {
      if (local_2d0[lVar9] == 1) {
        local_2c0[lVar9] = 2;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (int)local_2c8);
  }
  local_3c8.width = 0;
  local_3c8.height = 0;
  local_3c8.num_channels = 0;
  local_3c8.num_tiles = 0;
  local_3c8.level_x = 0;
  local_3c8.level_y = 0;
  local_3c8.images = (uchar **)0x0;
  local_3c8.tiles = (EXRTile *)0x0;
  local_3c8.next_level = (TEXRImage *)0x0;
  iVar5 = LoadEXRImageFromMemory(&local_3c8,(EXRHeader *)local_340,memory,size,err);
  if (iVar5 != 0) {
    return iVar5;
  }
  if (0 < (int)local_2c8) {
    pcVar6 = local_2d8->name + 1;
    uVar22 = 0xffffffff;
    uVar10 = 0;
    uVar23 = 0xffffffff;
    uVar13 = 0xffffffff;
    uVar12 = 0xffffffff;
    do {
      cVar1 = ((EXRChannelInfo *)(pcVar6 + -1))->name[0];
      if (cVar1 == 'R') {
        if (*pcVar6 == '\0') {
          uVar22 = uVar10 & 0xffffffff;
        }
      }
      else if (cVar1 == 'A') {
        if (*pcVar6 == '\0') {
          uVar12 = uVar10 & 0xffffffff;
        }
      }
      else if (cVar1 == 'B') {
        if (*pcVar6 == '\0') {
          uVar13 = uVar10 & 0xffffffff;
        }
      }
      else if ((cVar1 == 'G') && (*pcVar6 == '\0')) {
        uVar23 = uVar10 & 0xffffffff;
      }
      uVar10 = uVar10 + 1;
      pcVar6 = pcVar6 + 0x110;
    } while (local_2c8 != uVar10);
    iVar5 = local_3c8.width;
    iVar16 = local_3c8.height;
    if (local_2c8 == 1) {
      pfVar8 = (float *)malloc((long)local_3c8.width * (long)local_3c8.height * 0x10);
      *out_rgba = pfVar8;
      if (local_308 == 0) {
        if (0 < iVar16 * iVar5) {
          lVar9 = 0;
          lVar14 = 0;
          do {
            fVar24 = *(float *)(*local_3c8.images + lVar9);
            (*out_rgba)[lVar9] = fVar24;
            (*out_rgba)[lVar9 + 1] = fVar24;
            (*out_rgba)[lVar9 + 2] = fVar24;
            (*out_rgba)[lVar9 + 3] = fVar24;
            lVar14 = lVar14 + 1;
            lVar9 = lVar9 + 4;
          } while (lVar14 < (long)local_3c8.height * (long)local_3c8.width);
        }
      }
      else if (0 < local_3c8.num_tiles) {
        lVar9 = 0;
        do {
          if (0 < local_300) {
            iVar5 = 0;
            do {
              if (0 < local_304) {
                iVar16 = 0;
                do {
                  iVar18 = local_3c8.tiles[lVar9].offset_x * local_304 + iVar16;
                  if ((iVar18 < local_3c8.width) &&
                     (iVar20 = local_300 * local_3c8.tiles[lVar9].offset_y + iVar5,
                     iVar20 < local_3c8.height)) {
                    iVar18 = iVar18 + local_3c8.width * iVar20;
                    ppuVar2 = local_3c8.tiles[lVar9].images;
                    lVar14 = (long)(local_304 * iVar5 + iVar16);
                    (*out_rgba)[iVar18 * 4] = *(float *)(*ppuVar2 + lVar14 * 4);
                    (*out_rgba)[iVar18 * 4 + 1] = *(float *)(*ppuVar2 + lVar14 * 4);
                    (*out_rgba)[iVar18 * 4 + 2] = *(float *)(*ppuVar2 + lVar14 * 4);
                    (*out_rgba)[iVar18 * 4 + 3] = *(float *)(*ppuVar2 + lVar14 * 4);
                  }
                  iVar16 = iVar16 + 1;
                } while (iVar16 < local_304);
              }
              iVar5 = iVar5 + 1;
            } while (iVar5 < local_300);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < local_3c8.num_tiles);
      }
LAB_001c6b3f:
      *local_388 = local_3c8.width;
      *local_380 = local_3c8.height;
      FreeEXRHeader((EXRHeader *)local_340);
      FreeEXRImage(&local_3c8);
      return 0;
    }
    iVar5 = (int)uVar22;
    if (iVar5 != -1) {
      iVar18 = (int)uVar23;
      if (iVar18 == -1) {
        pcVar15 = "G channel not found";
        pcVar6 = "";
      }
      else {
        iVar20 = (int)uVar13;
        if (iVar20 != -1) {
          local_390 = (long)local_3c8.width;
          pfVar8 = (float *)malloc(local_390 * local_3c8.height * 0x10);
          *out_rgba = pfVar8;
          iVar11 = (int)uVar12;
          if (local_308 == 0) {
            if (0 < iVar16 * (int)local_390) {
              lVar9 = 0;
              lVar14 = 0;
              do {
                (*out_rgba)[lVar9] = *(float *)(local_3c8.images[iVar5] + lVar9);
                (*out_rgba)[lVar9 + 1] = *(float *)(local_3c8.images[iVar18] + lVar9);
                (*out_rgba)[lVar9 + 2] = *(float *)(local_3c8.images[iVar20] + lVar9);
                fVar24 = 1.0;
                if (iVar11 != -1) {
                  fVar24 = *(float *)(local_3c8.images[iVar11] + lVar9);
                }
                (*out_rgba)[lVar9 + 3] = fVar24;
                lVar14 = lVar14 + 1;
                lVar9 = lVar9 + 4;
              } while (lVar14 < (long)local_3c8.height * (long)local_3c8.width);
            }
          }
          else if (0 < local_3c8.num_tiles) {
            lVar9 = 0;
            do {
              if (0 < local_300) {
                iVar16 = 0;
                do {
                  if (0 < local_304) {
                    iVar19 = 0;
                    do {
                      iVar21 = local_3c8.tiles[lVar9].offset_x * local_304 + iVar19;
                      if ((iVar21 < local_3c8.width) &&
                         (iVar17 = local_300 * local_3c8.tiles[lVar9].offset_y + iVar16,
                         iVar17 < local_3c8.height)) {
                        iVar21 = iVar21 + local_3c8.width * iVar17;
                        ppuVar2 = local_3c8.tiles[lVar9].images;
                        lVar14 = (long)(local_304 * iVar16 + iVar19);
                        (*out_rgba)[iVar21 * 4] = *(float *)(ppuVar2[iVar5] + lVar14 * 4);
                        (*out_rgba)[iVar21 * 4 + 1] = *(float *)(ppuVar2[iVar18] + lVar14 * 4);
                        (*out_rgba)[iVar21 * 4 + 2] = *(float *)(ppuVar2[iVar20] + lVar14 * 4);
                        fVar24 = 1.0;
                        if (iVar11 != -1) {
                          fVar24 = *(float *)(ppuVar2[iVar11] + lVar14 * 4);
                        }
                        (*out_rgba)[(int)(iVar21 * 4 | 3)] = fVar24;
                      }
                      iVar19 = iVar19 + 1;
                    } while (iVar19 < local_304);
                  }
                  iVar16 = iVar16 + 1;
                  local_390 = lVar9;
                } while (iVar16 < local_300);
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 < local_3c8.num_tiles);
          }
          goto LAB_001c6b3f;
        }
        pcVar15 = "B channel not found";
        pcVar6 = "";
      }
      goto LAB_001c6aad;
    }
  }
  pcVar15 = "R channel not found";
  pcVar6 = "";
LAB_001c6aad:
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,pcVar15,pcVar6);
  poVar7 = local_1b8[0];
  if (err != (char **)0x0) {
    pcVar6 = strdup((char *)local_1b8[0]);
    *err = pcVar6;
  }
  if (poVar7 != local_1a8) {
    operator_delete(poVar7);
  }
  return -4;
}

Assistant:

int LoadEXRFromMemory(float **out_rgba, int *width, int *height,
                      const unsigned char *memory, size_t size,
                      const char **err) {
  if (out_rgba == NULL || memory == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXRFromMemory", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;

  InitEXRHeader(&exr_header);

  int ret = ParseEXRVersionFromMemory(&exr_version, memory, size);
  if (ret != TINYEXR_SUCCESS) {
    std::stringstream ss;
    ss << "Failed to parse EXR version. code(" << ret << ")";
    tinyexr::SetErrorMessage(ss.str(), err);
    return ret;
  }

  ret = ParseEXRHeaderFromMemory(&exr_header, &exr_version, memory, size, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  InitEXRImage(&exr_image);
  ret = LoadEXRImageFromMemory(&exr_image, &exr_header, memory, size, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exr_header.num_channels; c++) {
    if (strcmp(exr_header.channels[c].name, "R") == 0) {
      idxR = c;
    } else if (strcmp(exr_header.channels[c].name, "G") == 0) {
      idxG = c;
    } else if (strcmp(exr_header.channels[c].name, "B") == 0) {
      idxB = c;
    } else if (strcmp(exr_header.channels[c].name, "A") == 0) {
      idxA = c;
    }
  }

  // TODO(syoyo): Refactor removing same code as used in LoadEXR().
  if (exr_header.num_channels == 1) {
    // Grayscale channel only.

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (int j = 0; j < exr_header.tile_size_y; j++) {
          for (int i = 0; i < exr_header.tile_size_x; i++) {
            const int ii =
                exr_image.tiles[it].offset_x * exr_header.tile_size_x + i;
            const int jj =
                exr_image.tiles[it].offset_y * exr_header.tile_size_y + j;
            const int idx = ii + jj * exr_image.width;

            // out of region check.
            if (ii >= exr_image.width) {
              continue;
            }
            if (jj >= exr_image.height) {
              continue;
            }
            const int srcIdx = i + j * exr_header.tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 3] =
                reinterpret_cast<float **>(src)[0][srcIdx];
          }
        }
      }
    } else {
      for (int i = 0; i < exr_image.width * exr_image.height; i++) {
        const float val = reinterpret_cast<float **>(exr_image.images)[0][i];
        (*out_rgba)[4 * i + 0] = val;
        (*out_rgba)[4 * i + 1] = val;
        (*out_rgba)[4 * i + 2] = val;
        (*out_rgba)[4 * i + 3] = val;
      }
    }

  } else {
    // TODO(syoyo): Support non RGBA image.

    if (idxR == -1) {
      tinyexr::SetErrorMessage("R channel not found", err);

      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxG == -1) {
      tinyexr::SetErrorMessage("G channel not found", err);
      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxB == -1) {
      tinyexr::SetErrorMessage("B channel not found", err);
      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (int j = 0; j < exr_header.tile_size_y; j++)
          for (int i = 0; i < exr_header.tile_size_x; i++) {
            const int ii =
                exr_image.tiles[it].offset_x * exr_header.tile_size_x + i;
            const int jj =
                exr_image.tiles[it].offset_y * exr_header.tile_size_y + j;
            const int idx = ii + jj * exr_image.width;

            // out of region check.
            if (ii >= exr_image.width) {
              continue;
            }
            if (jj >= exr_image.height) {
              continue;
            }
            const int srcIdx = i + j * exr_header.tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[idxR][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[idxG][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[idxB][srcIdx];
            if (idxA != -1) {
              (*out_rgba)[4 * idx + 3] =
                  reinterpret_cast<float **>(src)[idxA][srcIdx];
            } else {
              (*out_rgba)[4 * idx + 3] = 1.0;
            }
          }
      }
    } else {
      for (int i = 0; i < exr_image.width * exr_image.height; i++) {
        (*out_rgba)[4 * i + 0] =
            reinterpret_cast<float **>(exr_image.images)[idxR][i];
        (*out_rgba)[4 * i + 1] =
            reinterpret_cast<float **>(exr_image.images)[idxG][i];
        (*out_rgba)[4 * i + 2] =
            reinterpret_cast<float **>(exr_image.images)[idxB][i];
        if (idxA != -1) {
          (*out_rgba)[4 * i + 3] =
              reinterpret_cast<float **>(exr_image.images)[idxA][i];
        } else {
          (*out_rgba)[4 * i + 3] = 1.0;
        }
      }
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);
  FreeEXRImage(&exr_image);

  return TINYEXR_SUCCESS;
}